

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_php_docstring_comment(t_php_generator *this,ostream *out,string *contents)

{
  allocator local_7b;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"/**\n",&local_79);
  std::__cxx11::string::string((string *)&local_58," * ",&local_7a);
  std::__cxx11::string::string((string *)&local_78," */\n",&local_7b);
  t_generator::generate_docstring_comment
            ((t_generator *)this,out,&local_38,&local_58,contents,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void t_php_generator::generate_php_docstring_comment(ostream& out, string contents) {
  generate_docstring_comment(out, "/**\n", " * ", contents, " */\n");
}